

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O1

REF_STATUS ref_cavity_topo(REF_CAVITY ref_cavity)

{
  REF_CELL pRVar1;
  REF_INT *pRVar2;
  uint uVar3;
  REF_LIST pRVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  REF_INT nodes [27];
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  
  pRVar4 = ref_cavity->tet_list;
  if (0 < pRVar4->n) {
    pRVar1 = ref_cavity->ref_grid->cell[8];
    lVar6 = 0;
    do {
      uVar5 = pRVar4->value[lVar6];
      uVar3 = ref_cell_nodes(pRVar1,uVar5,(REF_INT *)&local_a8);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x9d3,"ref_cavity_topo",(ulong)uVar3,"cell");
        return uVar3;
      }
      printf("old tet %d %d %d %d (%d)\n",(ulong)local_a8,(ulong)local_a4,(ulong)local_a0,
             (ulong)local_9c,(ulong)uVar5);
      lVar6 = lVar6 + 1;
      pRVar4 = ref_cavity->tet_list;
    } while (lVar6 < pRVar4->n);
  }
  if (0 < ref_cavity->maxface) {
    uVar5 = ref_cavity->node;
    lVar6 = 0;
    uVar8 = 0;
    do {
      pRVar2 = ref_cavity->f2n;
      if (((uVar5 != pRVar2[uVar8 * 3] && pRVar2[uVar8 * 3] != 0xffffffff) &&
          (uVar5 != pRVar2[uVar8 * 3 + 1])) && (uVar5 != pRVar2[uVar8 * 3 + 2])) {
        printf("new tet ");
        lVar7 = 0;
        do {
          printf(" %d ",(ulong)*(uint *)((long)ref_cavity->f2n + lVar7 * 4 + lVar6));
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        printf(" %d ",(ulong)uVar5);
        printf(" [%d]\n",uVar8 & 0xffffffff);
      }
      uVar8 = uVar8 + 1;
      lVar6 = lVar6 + 0xc;
    } while ((long)uVar8 < (long)ref_cavity->maxface);
  }
  pRVar4 = ref_cavity->tri_list;
  if (0 < pRVar4->n) {
    pRVar1 = ref_cavity->ref_grid->cell[3];
    lVar6 = 0;
    do {
      uVar5 = pRVar4->value[lVar6];
      uVar3 = ref_cell_nodes(pRVar1,uVar5,(REF_INT *)&local_a8);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x9e7,"ref_cavity_topo",(ulong)uVar3,"cell");
        return uVar3;
      }
      printf("old tri %d %d %d faceid %d (%d)\n",(ulong)local_a8,(ulong)local_a4,(ulong)local_a0,
             (ulong)local_9c,(ulong)uVar5);
      lVar6 = lVar6 + 1;
      pRVar4 = ref_cavity->tri_list;
    } while (lVar6 < pRVar4->n);
  }
  uVar5 = ref_cavity->surf_node;
  if (uVar5 == 0xffffffff) {
    uVar5 = ref_cavity->node;
  }
  if (0 < ref_cavity->maxseg) {
    lVar6 = 0;
    uVar8 = 0;
    do {
      uVar3 = *(uint *)((long)ref_cavity->s2n + lVar6);
      if ((uVar5 != uVar3 && uVar3 != 0xffffffff) &&
         (uVar5 != *(uint *)((long)ref_cavity->s2n + lVar6 + 4))) {
        printf("new tri ");
        printf(" %d ",(ulong)*(uint *)((long)ref_cavity->s2n + lVar6));
        printf(" %d ",(ulong)*(uint *)((long)ref_cavity->s2n + lVar6 + 4));
        printf(" %d ",(ulong)uVar5);
        printf(" faceid %d ",(ulong)*(uint *)((long)ref_cavity->s2n + lVar6 + 8));
        printf(" [%d]\n",uVar8 & 0xffffffff);
      }
      uVar8 = uVar8 + 1;
      lVar6 = lVar6 + 0xc;
    } while ((long)uVar8 < (long)ref_cavity->maxseg);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_topo(REF_CAVITY ref_cavity) {
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT item, cell, face, face_node, seg;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  ref_cell = ref_grid_tet(ref_cavity_grid(ref_cavity));
  each_ref_list_item(ref_cavity_tet_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tet_list(ref_cavity), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell");
    printf("old tet %d %d %d %d (%d)\n", nodes[0], nodes[1], nodes[2], nodes[3],
           cell);
  }

  node = ref_cavity_node(ref_cavity);
  each_ref_cavity_valid_face(ref_cavity, face) {
    if (node == ref_cavity_f2n(ref_cavity, 0, face)) continue;
    if (node == ref_cavity_f2n(ref_cavity, 1, face)) continue;
    if (node == ref_cavity_f2n(ref_cavity, 2, face)) continue;
    printf("new tet ");
    for (face_node = 0; face_node < 3; face_node++)
      printf(" %d ", ref_cavity_f2n(ref_cavity, face_node, face));
    printf(" %d ", node);
    printf(" [%d]\n", face);
  }

  ref_cell = ref_grid_tri(ref_cavity_grid(ref_cavity));
  each_ref_list_item(ref_cavity_tri_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tri_list(ref_cavity), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell");
    printf("old tri %d %d %d faceid %d (%d)\n", nodes[0], nodes[1], nodes[2],
           nodes[3], cell);
  }

  node = ref_cavity_seg_node(ref_cavity);
  each_ref_cavity_valid_seg(ref_cavity, seg) {
    if (node == ref_cavity_s2n(ref_cavity, 0, seg)) continue;
    if (node == ref_cavity_s2n(ref_cavity, 1, seg)) continue;
    printf("new tri ");
    printf(" %d ", ref_cavity_s2n(ref_cavity, 0, seg));
    printf(" %d ", ref_cavity_s2n(ref_cavity, 1, seg));
    printf(" %d ", node);
    printf(" faceid %d ", ref_cavity_s2n(ref_cavity, 2, seg));
    printf(" [%d]\n", seg);
  }

  return REF_SUCCESS;
}